

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl.c
# Opt level: O0

int param_copy(EVP_PKEY *to,EVP_PKEY *from)

{
  void *__dest;
  char *pcVar1;
  void *pvVar2;
  thecl_param_t *copy;
  thecl_param_t *param_local;
  
  __dest = calloc(1,0x28);
  memcpy(__dest,to,0x28);
  if (*(int *)((long)__dest + 8) == 0x7a) {
    pcVar1 = strdup((char *)to->ameth);
    *(char **)((long)__dest + 0x10) = pcVar1;
  }
  else if (*(int *)((long)__dest + 8) == 0x6d) {
    pvVar2 = malloc((size_t)to->ameth);
    *(void **)((long)__dest + 0x18) = pvVar2;
    memcpy(*(void **)((long)__dest + 0x18),to->engine,(size_t)to->ameth);
  }
  return (int)__dest;
}

Assistant:

thecl_param_t*
param_copy(
    thecl_param_t* param
) {
    thecl_param_t* copy = calloc(1, sizeof(thecl_param_t));
    memcpy(copy, param, sizeof(thecl_param_t));
    /* Handle possible pointers in the value. */
    if (copy->value.type == 'z')
        copy->value.val.z = strdup(param->value.val.z);
    else if (copy->value.type == 'm') {
        copy->value.val.m.data = malloc(param->value.val.m.length);
        memcpy(copy->value.val.m.data, param->value.val.m.data, param->value.val.m.length);
    }
    return copy;
}